

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main)

{
  undefined8 *puVar1;
  float fVar2;
  uint32_t a;
  WebPPicture *pic;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  WebPWorker *pWVar8;
  WebPWorker *pWVar9;
  WebPWorker *pWVar10;
  WebPWorkerInterface *pWVar11;
  VP8LBitWriter *src;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  int iVar16;
  VP8LEncoder *pVVar17;
  uint32_t *puVar18;
  CrunchSubConfig CVar19;
  uint32_t *puVar20;
  uint8_t *puVar21;
  byte bVar22;
  int sorting_method;
  PaletteSorting PVar23;
  PaletteSorting *pPVar24;
  long lVar25;
  ulong uVar26;
  WebPWorker *pWVar27;
  int iVar28;
  ulong uVar29;
  int *piVar30;
  int in_R8D;
  int in_R9D;
  ulong uVar31;
  uint uVar32;
  uint32_t *puVar33;
  VP8LEncoder *pVVar34;
  WebPConfig *pWVar35;
  StreamEncodeContext *pSVar36;
  bool bVar37;
  PaletteSorting local_86c;
  WebPPicture *local_868;
  VP8LEncoder *local_860;
  VP8LEncoder *local_858;
  uint32_t *local_850;
  uint local_844;
  WebPWorkerInterface *local_840;
  uint32_t *local_838;
  uint32_t *local_830;
  uint32_t *local_828;
  VP8LBitWriter *local_820;
  WebPConfig *local_818;
  uint32_t *local_810;
  int local_804;
  uint local_800;
  uint local_7fc;
  int local_7f8;
  int local_7f4;
  ulong local_7f0;
  ulong local_7e8;
  WebPConfig *local_7e0;
  uint32_t *local_7d8;
  uint32_t *local_7d0;
  uint32_t *local_7c8;
  uint32_t *local_7c0;
  long local_7b8;
  uint32_t *local_7b0;
  uint32_t *local_7a8;
  uint32_t *local_7a0;
  uint32_t *local_798;
  uint32_t *local_790;
  VP8LBitWriter bw_side;
  WebPWorker worker_side;
  WebPWorker worker_main;
  StreamEncodeContext params_main;
  CrunchConfig crunch_configs [14];
  StreamEncodeContext params_side;
  WebPAuxStats stats_side;
  WebPPicture picture_side;
  
  local_818 = config;
  pVVar17 = VP8LEncoderNew(config,picture);
  local_840 = WebPGetWorkerInterface();
  if ((pVVar17 == (VP8LEncoder *)0x0) || (iVar12 = VP8LBitWriterInit(&bw_side,0), iVar12 == 0)) {
    VP8LEncoderDelete(pVVar17);
    iVar12 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar12;
  }
  iVar12 = WebPPictureInitInternal(&picture_side,0x210);
  pVVar34 = (VP8LEncoder *)0x0;
  local_858 = pVVar17;
  if (iVar12 != 0) {
    local_7e0 = pVVar17->config;
    pic = pVVar17->pic;
    iVar12 = local_7e0->method;
    local_7f0 = (ulong)(uint)pic->width;
    local_7e8 = (ulong)(uint)pic->height;
    uVar32 = 6;
    if (3 < iVar12) {
      uVar32 = iVar12 == 4 | 4;
    }
    local_7c0 = pVVar17->palette_sorted;
    local_868 = picture;
    local_820 = bw_main;
    uVar13 = GetColorPalette(pic,local_7c0);
    if ((int)uVar13 < 0x101) {
      pVVar34 = (VP8LEncoder *)(ulong)uVar13;
    }
    iVar16 = (int)pVVar34;
    pVVar17->palette_size = iVar16;
    uVar14 = ClampBits(pic->width,pic->height,((uint)((int)uVar13 < 0x101) * 2 - iVar12) + 7,0xa28,
                       in_R8D,in_R9D);
    picture = local_868;
    local_7fc = uVar32;
    if (uVar14 <= uVar32) {
      local_7fc = uVar14;
    }
    pVVar17->histo_bits = uVar14;
    pVVar17->predictor_transform_bits = local_7fc;
    pVVar17->cross_color_transform_bits = local_7fc;
    if (iVar12 == 0) {
      crunch_configs[0].entropy_idx = ((int)uVar13 < 0x101) + 3;
      crunch_configs[0].palette_sorting_type = (uint)(0x100 < (int)uVar13) * 3;
      uVar32 = 1;
      pPVar24 = &local_86c;
      iVar28 = 0;
      iVar12 = 0;
LAB_0015f4d4:
      *pPVar24 = kMinimizeDelta;
LAB_0015fa34:
      PVar23 = local_86c;
      uVar26 = 0;
      uVar29 = 0;
      if (0 < (int)local_86c) {
        uVar29 = (ulong)local_86c;
      }
      piVar30 = &crunch_configs[0].sub_configs[0].do_no_cache;
      for (; uVar26 != uVar29; uVar26 = uVar26 + 1) {
        for (uVar31 = 0; uVar32 != uVar31; uVar31 = uVar31 + 1) {
          piVar30[uVar31 * 2 + -1] = 4 - (uint)(uVar31 == 0);
          piVar30[uVar31 * 2] = iVar12;
        }
        crunch_configs[uVar26].sub_configs_size = uVar32;
        piVar30 = piVar30 + 7;
      }
      iVar12 = EncoderInit(local_858);
      if (iVar12 != 0) {
        lVar25 = 0;
        iVar12 = 0;
        if (0 < local_818->thread_level) {
          iVar12 = (int)((long)(int)PVar23 / 2);
          uVar29 = 0;
          uVar26 = (long)(int)PVar23 / 2 & 0xffffffff;
          if (iVar12 < 1) {
            uVar26 = uVar29;
          }
          for (; uVar26 * 0x1c - uVar29 != 0; uVar29 = uVar29 + 0x1c) {
            puVar1 = (undefined8 *)
                     ((long)&((CrunchConfig *)
                             (crunch_configs[(int)(PVar23 - iVar12)].sub_configs + -1))->entropy_idx
                     + uVar29);
            uVar3 = *puVar1;
            uVar4 = puVar1[1];
            puVar1 = (undefined8 *)
                     ((long)&crunch_configs[(int)(PVar23 - iVar12)].sub_configs[0].do_no_cache +
                     uVar29);
            uVar5 = puVar1[1];
            *(undefined8 *)
             ((long)&params_side.crunch_configs[0].sub_configs[0].do_no_cache + uVar29) = *puVar1;
            *(undefined8 *)
             ((long)&params_side.crunch_configs[0].sub_configs[1].do_no_cache + uVar29) = uVar5;
            *(undefined8 *)
             ((long)&((CrunchConfig *)(params_side.crunch_configs[0].sub_configs + -1))->entropy_idx
             + uVar29) = uVar3;
            *(undefined8 *)((long)&params_side.crunch_configs[0].sub_configs[0].lz77 + uVar29) =
                 uVar4;
          }
          params_side.num_crunch_configs = iVar12;
        }
        local_850 = (uint32_t *)CONCAT44(local_850._4_4_,iVar12);
        local_86c = PVar23 - iVar12;
        uVar26 = 0;
        if (0 < (int)local_86c) {
          uVar26 = (ulong)local_86c;
        }
        for (; uVar26 * 0x1c - lVar25 != 0; lVar25 = lVar25 + 0x1c) {
          uVar3 = *(undefined8 *)
                   ((long)&((CrunchConfig *)(crunch_configs[0].sub_configs + -1))->entropy_idx +
                   lVar25);
          uVar4 = *(undefined8 *)((long)&crunch_configs[0].sub_configs[0].lz77 + lVar25);
          uVar5 = *(undefined8 *)((long)&crunch_configs[0].sub_configs[1].do_no_cache + lVar25);
          *(undefined8 *)((long)&params_main.crunch_configs[0].sub_configs[0].do_no_cache + lVar25)
               = *(undefined8 *)((long)&crunch_configs[0].sub_configs[0].do_no_cache + lVar25);
          *(undefined8 *)((long)&params_main.crunch_configs[0].sub_configs[1].do_no_cache + lVar25)
               = uVar5;
          *(undefined8 *)
           ((long)&((CrunchConfig *)(params_main.crunch_configs[0].sub_configs + -1))->entropy_idx +
           lVar25) = uVar3;
          *(undefined8 *)((long)&params_main.crunch_configs[0].sub_configs[0].lz77 + lVar25) = uVar4
          ;
        }
        local_828 = (uint32_t *)CONCAT44(local_828._4_4_,(0 < iVar12) + 1);
        local_838 = local_858->palette;
        puVar20 = (uint32_t *)0x0;
        local_860 = (VP8LEncoder *)0x0;
        local_830 = (uint32_t *)CONCAT44(local_830._4_4_,iVar28);
        params_main.num_crunch_configs = local_86c;
        while( true ) {
          pVVar17 = local_860;
          if ((int)local_828 == (int)puVar20) break;
          bVar37 = (int)puVar20 == 0;
          pWVar27 = &worker_side;
          if (bVar37) {
            pWVar27 = &worker_main;
          }
          pSVar36 = &params_side;
          if (bVar37) {
            pSVar36 = &params_main;
          }
          pSVar36->config = local_818;
          pSVar36->red_and_blue_always_zero = iVar28;
          local_810 = puVar20;
          if (bVar37) {
            params_main.stats = picture->stats;
            params_main.bw = local_820;
            params_main.enc = local_858;
            pWVar8 = &worker_main;
            pWVar9 = &worker_main;
            pWVar10 = &worker_main;
            params_main.picture = picture;
          }
          else {
            WebPPictureView(picture,0,0,picture->width,picture->height,&picture_side);
            picture_side.progress_hook = (WebPProgressHook)0x0;
            params_side.stats = picture->stats;
            if (picture->stats != (WebPAuxStats *)0x0) {
              params_side.stats = &stats_side;
            }
            params_side.picture = &picture_side;
            iVar12 = VP8LBitWriterClone(local_820,&bw_side);
            if (iVar12 == 0) {
              WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
              pVVar17 = local_860;
              goto LAB_0015feed;
            }
            params_side.bw = &bw_side;
            pVVar17 = VP8LEncoderNew(local_818,&picture_side);
            if ((pVVar17 == (VP8LEncoder *)0x0) || (iVar12 = EncoderInit(pVVar17), iVar12 == 0)) {
              picture_side.error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
              goto LAB_0015fee8;
            }
            iVar12 = local_858->predictor_transform_bits;
            pVVar17->histo_bits = local_858->histo_bits;
            pVVar17->predictor_transform_bits = iVar12;
            pVVar17->cross_color_transform_bits = local_858->cross_color_transform_bits;
            pVVar17->palette_size = local_858->palette_size;
            memcpy(pVVar17->palette,local_838,0x400);
            memcpy(pVVar17->palette_sorted,local_7c0,0x400);
            pWVar8 = &worker_side;
            pWVar9 = &worker_side;
            pWVar10 = &worker_side;
            local_860 = pVVar17;
            params_side.enc = pVVar17;
            iVar28 = (int)local_830;
          }
          (*local_840->Init)(pWVar27);
          pWVar8->data1 = pSVar36;
          pWVar9->data2 = (void *)0x0;
          pWVar10->hook = EncodeStreamHook;
          puVar20 = (uint32_t *)(ulong)((int)local_810 + 1);
          picture = local_868;
        }
        iVar12 = (int)local_850;
        if ((int)local_850 == 0) {
LAB_0015fdea:
          pWVar11 = local_840;
          (*local_840->Execute)(&worker_main);
          iVar16 = (*pWVar11->Sync)(&worker_main);
          (*pWVar11->End)(&worker_main);
          picture = local_868;
          if (iVar12 == 0) goto LAB_0015feed;
          iVar12 = (*pWVar11->Sync)(&worker_side);
          (*pWVar11->End)(&worker_side);
          src = local_820;
          if ((iVar16 != 0) && (iVar12 != 0)) {
            puVar21 = (uint8_t *)VP8LBitWriterNumBytes(local_820);
            picture = local_868;
            if (bw_side.cur + ((long)(bw_side.used + 7 >> 3) - (long)bw_side.buf) < puVar21) {
              VP8LBitWriterSwap(src,&bw_side);
              if (picture->stats != (WebPAuxStats *)0x0) {
                memcpy(picture->stats,&stats_side,0xbc);
              }
            }
            goto LAB_0015feed;
          }
          picture = local_868;
          if (local_868->error_code != VP8_ENC_OK) goto LAB_0015feed;
        }
        else {
          iVar16 = (*local_840->Reset)(&worker_side);
          if (iVar16 != 0) {
            if (picture->stats != (WebPAuxStats *)0x0) {
              memcpy(&stats_side,picture->stats,0xbc);
            }
            (*local_840->Launch)(&worker_side);
            goto LAB_0015fdea;
          }
          picture_side.error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
        }
LAB_0015fee8:
        WebPEncodingSetError(picture,picture_side.error_code);
        goto LAB_0015feed;
      }
    }
    else {
      iVar28 = 1;
      uVar32 = (iVar16 < 0x11) + 1;
      if (iVar16 < 1) {
        uVar32 = 1;
      }
      local_860 = pVVar34;
      if ((int)uVar13 < 0x101 && iVar16 < 0x11) {
        iVar16 = 4;
        pWVar35 = local_7e0;
LAB_0015f900:
        fVar2 = pWVar35->quality;
        if (((iVar12 != 6) || (fVar2 != 100.0)) || (NAN(fVar2))) {
          local_86c = kMinimizeDelta;
          crunch_configs[0].palette_sorting_type = (uint)(0x100 < (int)uVar13) * 2 + kMinimizeDelta;
          crunch_configs[0].entropy_idx = iVar16;
          if (iVar12 != 5 || fVar2 < 75.0) {
            iVar12 = 0;
          }
          else {
            if (iVar16 == 4) {
              local_86c = kModifiedZeng;
              pPVar24 = &crunch_configs[1].palette_sorting_type;
              crunch_configs[1].entropy_idx = 5;
              iVar12 = 1;
              goto LAB_0015f4d4;
            }
            iVar12 = 1;
          }
        }
        else {
          local_86c = kSortedDefault;
          for (uVar14 = 0; uVar14 != 6; uVar14 = uVar14 + 1) {
            if ((int)uVar13 < 0x101 || uVar14 < 4) {
              if ((uVar14 & 6) == 4 && (int)uVar13 < 0x101) {
                PVar23 = kSortedDefault;
                do {
                  if ((PVar23 != kSortedDefault) && (PVar23 != kUnusedPalette)) {
                    if (PVar23 == kPaletteSortingNum) goto LAB_0015f9b1;
                    crunch_configs[(int)local_86c].entropy_idx = uVar14;
                    crunch_configs[(int)local_86c].palette_sorting_type = PVar23;
                    local_86c = local_86c + kMinimizeDelta;
                  }
                  PVar23 = PVar23 + kMinimizeDelta;
                } while( true );
              }
              crunch_configs[(int)local_86c].entropy_idx = uVar14;
              crunch_configs[(int)local_86c].palette_sorting_type = kUnusedPalette;
              local_86c = local_86c + kMinimizeDelta;
            }
LAB_0015f9b1:
          }
          iVar12 = 1;
        }
        goto LAB_0015fa34;
      }
      puVar20 = pic->argb;
      iVar16 = pic->argb_stride;
      local_844 = uVar13;
      local_804 = iVar12;
      local_800 = uVar32;
      puVar18 = (uint32_t *)WebPSafeCalloc(0xd,0x400);
      if (puVar18 != (uint32_t *)0x0) {
        uVar15 = *puVar20;
        local_790 = puVar18 + 0x400;
        local_798 = puVar18 + 0x200;
        local_7a0 = puVar18 + 0x600;
        local_830 = puVar18 + 0x100;
        local_838 = puVar18 + 0x500;
        local_850 = puVar18 + 0x300;
        local_7c8 = puVar18 + 0x700;
        local_7a8 = puVar18 + 0x800;
        local_7b0 = puVar18 + 0xa00;
        local_7d0 = puVar18 + 0x900;
        local_7d8 = puVar18 + 0xb00;
        uVar26 = 0;
        if (0 < (int)local_7f0) {
          uVar26 = local_7f0 & 0xffffffff;
        }
        local_7f8 = 0;
        if (0 < (int)local_7e8) {
          local_7f8 = (int)local_7e8;
        }
        local_7b8 = (long)iVar16 << 2;
        iVar12 = 0;
        puVar33 = (uint32_t *)0x0;
        local_828 = puVar18;
        while (pWVar35 = local_7e0, puVar18 = local_828, iVar12 != local_7f8) {
          puVar18 = puVar20;
          local_810 = puVar20;
          local_7f4 = iVar12;
          for (uVar29 = 0; uVar26 != uVar29; uVar29 = uVar29 + 1) {
            a = puVar18[uVar29];
            uVar15 = VP8LSubPixels(a,uVar15);
            puVar20 = local_828;
            if ((uVar15 != 0) && ((puVar33 == (uint32_t *)0x0 || (a != puVar33[uVar29])))) {
              AddSingle(a,local_828,local_790,local_798,local_7a0);
              AddSingle(uVar15,local_830,local_838,local_850,local_7c8);
              AddSingleSubGreen(a,local_7a8,local_7b0);
              AddSingleSubGreen(uVar15,local_7d0,local_7d8);
              piVar30 = (int *)((long)puVar20 +
                               (ulong)(((a >> 0x13) + a) * 0x39c5fba7 >> 0x16 & 0xfffffffc) + 0x3000
                               );
              *piVar30 = *piVar30 + 1;
              puVar18 = local_810;
            }
            uVar15 = a;
          }
          puVar20 = (uint32_t *)((long)puVar18 + local_7b8);
          puVar33 = puVar18;
          iVar12 = local_7f4 + 1;
        }
        *local_7d0 = *local_7d0 + 1;
        *local_7d8 = *local_7d8 + 1;
        *local_838 = *local_838 + 1;
        *local_850 = *local_850 + 1;
        *local_7c8 = *local_7c8 + 1;
        *local_830 = *local_830 + 1;
        puVar20 = local_828;
        for (lVar25 = 0; picture = local_868, lVar25 != 0xd; lVar25 = lVar25 + 1) {
          CVar19 = (CrunchSubConfig)VP8LBitsEntropy(puVar20,0x100);
          params_main.crunch_configs[0].sub_configs[lVar25 + -5] = CVar19;
          puVar20 = puVar20 + 0x100;
        }
        params_side.config =
             (WebPConfig *)
             ((long)&(params_main.config)->lossless +
             (long)&(params_main.bw)->bits +
             (long)params_main.crunch_configs[0].sub_configs[1] +
             params_main.crunch_configs[0]._0_8_);
        iVar28 = 1;
        bVar22 = (byte)local_7fc;
        iVar12 = 1 << (bVar22 & 0x1f);
        params_side.bw =
             (VP8LBitWriter *)
             ((long)&(params_main.config)->lossless +
             (long)&(params_main.bw)->bits +
             params_main.crunch_configs[1]._20_8_ + params_main.crunch_configs[1]._4_8_);
        lVar25 = (ulong)((iVar12 + (int)local_7e8) - 1U >> (bVar22 & 0x1f)) *
                 (ulong)(((int)local_7f0 + iVar12) - 1U >> (bVar22 & 0x1f));
        params_side.picture =
             (WebPPicture *)
             ((long)params_main.picture +
             (long)(params_main.enc)->palette +
             lVar25 * 0x1e75768 +
             params_main.crunch_configs._24_8_ +
             (long)params_main.crunch_configs[0].sub_configs[0] + -0x68);
        params_side.enc =
             (VP8LEncoder *)
             ((long)params_main.picture +
             (long)(params_main.enc)->palette +
             lVar25 * 0x24ae00d +
             params_main.crunch_configs[2]._0_8_ +
             params_main.crunch_configs[1].sub_configs._4_8_ + -0x68);
        params_side.crunch_configs[0]._0_8_ =
             (long)(int)local_860 * 0x4000000 + (long)params_main.crunch_configs[2].sub_configs[0];
        uVar29 = 0;
        uVar32 = 0;
        for (uVar26 = 1; iVar16 = (int)uVar29, ((ulong)((int)local_844 < 0x101) | 4) != uVar26;
            uVar26 = uVar26 + 1) {
          uVar31 = uVar26 & 0xffffffff;
          uVar13 = (uint)uVar26;
          if ((ulong)params_side.crunch_configs[0].sub_configs[(ulong)uVar32 - 5] <=
              (ulong)params_side.crunch_configs[0].sub_configs[uVar26 - 5]) {
            uVar31 = uVar29;
            uVar13 = uVar32;
          }
          uVar32 = uVar13;
          uVar29 = uVar31;
        }
        lVar25 = 1;
        do {
          if (lVar25 == 0x100) goto LAB_0015f8eb;
          lVar6 = (ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar29 * 2 + 1] * 0x100 + lVar25;
          lVar7 = (ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar29 * 2] * 0x100 + lVar25;
          lVar25 = lVar25 + 1;
        } while (puVar18[lVar6] == 0 && puVar18[lVar7] == 0);
        iVar28 = 0;
LAB_0015f8eb:
        WebPSafeFree(puVar18);
        uVar13 = local_844;
        iVar12 = local_804;
        uVar32 = local_800;
        goto LAB_0015f900;
      }
    }
    WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  pVVar17 = (VP8LEncoder *)0x0;
LAB_0015feed:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(local_858);
  VP8LEncoderDelete(pVVar17);
  return (uint)(picture->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeStream(const WebPConfig* const config,
                     const WebPPicture* const picture,
                     VP8LBitWriter* const bw_main) {
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  WebPPicture picture_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  if (enc_main == NULL || !VP8LBitWriterInit(&bw_side, 0)) {
    VP8LEncoderDelete(enc_main);
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // Avoid "garbage value" error from Clang's static analysis tool.
  if (!WebPPictureInit(&picture_side)) {
    goto Error;
  }

  // Analyze image (entropy, num_palettes etc)
  if (!EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config = config;
      param->red_and_blue_always_zero = red_and_blue_always_zero;
      if (idx == 0) {
        param->picture = picture;
        param->stats = picture->stats;
        param->bw = bw_main;
        param->enc = enc_main;
      } else {
        // Create a side picture (error_code is not thread-safe).
        if (!WebPPictureView(picture, /*left=*/0, /*top=*/0, picture->width,
                             picture->height, &picture_side)) {
          assert(0);
        }
        picture_side.progress_hook = NULL;  // Progress hook is not thread-safe.
        param->picture = &picture_side;  // No need to free a view afterwards.
        param->stats = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        param->bw = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, &picture_side);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits = enc_main->histo_bits;
        enc_side->predictor_transform_bits =
            enc_main->predictor_transform_bits;
        enc_side->cross_color_transform_bits =
            enc_main->cross_color_transform_bits;
        enc_side->palette_size = enc_main->palette_size;
        memcpy(enc_side->palette, enc_main->palette,
               sizeof(enc_main->palette));
        memcpy(enc_side->palette_sorted, enc_main->palette_sorted,
               sizeof(enc_main->palette_sorted));
        param->enc = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      if (picture->error_code == VP8_ENC_OK) {
        assert(picture_side.error_code != VP8_ENC_OK);
        WebPEncodingSetError(picture, picture_side.error_code);
      }
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  }

 Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return (picture->error_code == VP8_ENC_OK);
}